

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrame.h
# Opt level: O2

void __thiscall chrono::ChFrame<double>::SetRot(ChFrame<double> *this,ChMatrix33<double> *mA)

{
  ChQuaternion<double> CStack_38;
  
  ChMatrix33<double>::Get_A_quaternion(&CStack_38,mA);
  ChQuaternion<double>::operator=(&(this->coord).rot,&CStack_38);
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>>
            (&(this->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>,
             &mA->super_Matrix<double,_3,_3,_1,_3,_3>);
  return;
}

Assistant:

void SetRot(const ChMatrix33<Real>& mA) {
        coord.rot = mA.Get_A_quaternion();
        Amatrix = mA;
    }